

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

void nvpair_free(nvpair_t *nvp)

{
  void *__ptr;
  char *__assertion;
  ulong uVar1;
  
  if (nvp == (nvpair_t *)0x0) {
    __assertion = "(nvp) != ((void*)0)";
LAB_0010d4ef:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x7db,"void nvpair_free(nvpair_t *)");
  }
  if (nvp->nvp_magic != 0x6e7670) {
    __assertion = "(nvp)->nvp_magic == 0x6e7670";
    goto LAB_0010d4ef;
  }
  if (nvp->nvp_list != (nvlist_t *)0x0) {
    __assert_fail("nvp->nvp_list == ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x7dc,"void nvpair_free(nvpair_t *)");
  }
  nvp->nvp_magic = 0;
  switch(nvp->nvp_type) {
  case 4:
  case 7:
  case 8:
  case 9:
    __ptr = (void *)nvp->nvp_data;
    break;
  case 5:
    nvlist_destroy((nvlist_t *)nvp->nvp_data);
    goto switchD_0010d45f_default;
  case 6:
    close((int)nvp->nvp_data);
    goto switchD_0010d45f_default;
  case 10:
    for (uVar1 = 0; __ptr = (void *)nvp->nvp_data, uVar1 < nvp->nvp_nitems; uVar1 = uVar1 + 1) {
      free(*(void **)((long)__ptr + uVar1 * 8));
    }
    break;
  case 0xb:
    for (uVar1 = 0; __ptr = (void *)nvp->nvp_data, uVar1 < nvp->nvp_nitems; uVar1 = uVar1 + 1) {
      nvlist_destroy(*(nvlist_t **)((long)__ptr + uVar1 * 8));
    }
    break;
  case 0xc:
    for (uVar1 = 0; __ptr = (void *)nvp->nvp_data, uVar1 < nvp->nvp_nitems; uVar1 = uVar1 + 1) {
      close(*(int *)((long)__ptr + uVar1 * 4));
    }
    break;
  default:
    goto switchD_0010d45f_default;
  }
  free(__ptr);
switchD_0010d45f_default:
  free(nvp);
  return;
}

Assistant:

void
nvpair_free(nvpair_t *nvp)
{
	size_t i;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_list == NULL);

	nvp->nvp_magic = 0;
	switch (nvp->nvp_type) {
	case NV_TYPE_DESCRIPTOR:
		close((int)nvp->nvp_data);
		break;
	case NV_TYPE_DESCRIPTOR_ARRAY:
		for (i = 0; i < nvp->nvp_nitems; i++)
			close(((int *)(intptr_t)nvp->nvp_data)[i]);
		nv_free((int *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_NVLIST:
		nvlist_destroy((nvlist_t *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_STRING:
		nv_free((char *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_BINARY:
		nv_free((void *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_NVLIST_ARRAY:
		for (i = 0; i < nvp->nvp_nitems; i++) {
			nvlist_destroy(
			    ((nvlist_t **)(intptr_t)nvp->nvp_data)[i]);
		}
		nv_free(((nvlist_t **)(intptr_t)nvp->nvp_data));
		break;
	case NV_TYPE_NUMBER_ARRAY:
		nv_free((uint64_t *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_BOOL_ARRAY:
		nv_free((bool *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_STRING_ARRAY:
		for (i = 0; i < nvp->nvp_nitems; i++)
			nv_free(((char **)(intptr_t)nvp->nvp_data)[i]);
		nv_free((char **)(intptr_t)nvp->nvp_data);
		break;
	}
	nv_free(nvp);
}